

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O1

void MIR_load_module(MIR_context_t ctx,MIR_module_t_conflict m)

{
  MIR_func_t pMVar1;
  VARR_MIR_module_t *pVVar2;
  MIR_item_t_conflict item_00;
  long lVar3;
  MIR_error_func_t p_Var4;
  bool bVar5;
  int iVar6;
  MIR_item_t_conflict item;
  anon_union_8_10_166bea1d_for_u aVar7;
  MIR_insn_t_conflict pMVar8;
  anon_union_8_10_166bea1d_for_u item_01;
  MIR_item_t pMVar9;
  ulong uVar10;
  MIR_module_t_conflict *ppMVar11;
  void *pvVar12;
  char *pcVar13;
  char *pcVar14;
  MIR_item_t pMVar15;
  MIR_item_t pMVar16;
  anon_union_8_10_166bea1d_for_u aVar17;
  int extraout_EDX;
  anon_union_8_10_166bea1d_for_u *paVar18;
  MIR_error_type_t MVar19;
  MIR_context_t pMVar20;
  size_t sVar21;
  long lVar22;
  MIR_context_t pMVar23;
  
  if (m == (MIR_module_t_conflict)0x0) {
LAB_001337f0:
    __assert_fail("m != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0x765,"void MIR_load_module(MIR_context_t, MIR_module_t)");
  }
  aVar17 = (anon_union_8_10_166bea1d_for_u)(m->items).head;
  item_01 = (anon_union_8_10_166bea1d_for_u)m;
  if (aVar17.func != (MIR_func_t)0x0) {
    bVar5 = false;
    pMVar20 = ctx;
    do {
      iVar6 = *(int *)&((aVar17.func)->insns).tail;
      if (iVar6 - 5U < 5) {
        if (iVar6 == 7) {
          bVar5 = true;
        }
        item_01 = aVar17;
        pMVar20 = ctx;
        aVar7.func = (MIR_func_t)load_bss_data_section(ctx,aVar17.func,0);
      }
      else {
        aVar7 = aVar17;
        if (iVar6 == 0) {
          if (((aVar17.func)->original_insns).tail == (MIR_insn_t_conflict)0x0) {
            pMVar8 = (MIR_insn_t_conflict)_MIR_publish_code(ctx,short_jmp_pattern,0xd);
            ((aVar17.func)->original_insns).tail = pMVar8;
          }
          item_01 = (anon_union_8_10_166bea1d_for_u)(aVar17.lref_data)->load_addr;
          pMVar20 = ctx;
          _MIR_redirect_thunk(ctx,item_01.func,undefined_interface);
        }
      }
      if ((char)(aVar17.func)->nres != '\0') {
        if (*(int *)&((aVar17.func)->insns).tail - 2U < 3) {
          __assert_fail("first_item->item_type != MIR_export_item && first_item->item_type != MIR_import_item && first_item->item_type != MIR_forward_item"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                        ,0x77b,"void MIR_load_module(MIR_context_t, MIR_module_t)");
        }
        item_01.func = (MIR_func_t)MIR_item_name(pMVar20,aVar17.func);
        pMVar20 = ctx;
        iVar6 = setup_global(ctx,item_01.import_id,(aVar17.lref_data)->load_addr,
                             (MIR_item_t_conflict)aVar17.func);
        if (((iVar6 != 0) && (*(int *)&((aVar7.func)->insns).tail == 0)) &&
           (ctx->func_redef_permission_p == 0)) {
          pcVar13 = ((anon_union_8_10_166bea1d_for_u *)&(aVar7.func)->last_temp_num)->func->name;
          pcVar14 = "func %s is prohibited for redefinition";
          MVar19 = MIR_repeated_decl_error;
          goto LAB_001337eb;
        }
      }
      aVar17 = (anon_union_8_10_166bea1d_for_u)((aVar7.func)->insns).head;
    } while (aVar17.func != (MIR_func_t)0x0);
    if ((bVar5) && (pMVar9 = (m->items).head, pMVar15 = pMVar9, pMVar9 != (MIR_item_t_conflict)0x0))
    {
      do {
        if (pMVar15->item_type == MIR_func_item) {
          for (paVar18 = (anon_union_8_10_166bea1d_for_u *)(((pMVar15->u).func)->insns).head;
              paVar18 != (anon_union_8_10_166bea1d_for_u *)0x0;
              paVar18 = (anon_union_8_10_166bea1d_for_u *)paVar18[2].func) {
            if (*(int *)(paVar18 + 3) == 0xb4) {
              item_01 = pMVar15->u;
              *paVar18 = item_01;
            }
          }
        }
        pMVar15 = (pMVar15->item_link).next;
        pMVar16 = pMVar9;
      } while (pMVar15 != (MIR_item_t)0x0);
      do {
        if (pMVar16->item_type == MIR_lref_data_item) {
          pMVar1 = (pMVar16->u).func;
          item_01 = (anon_union_8_10_166bea1d_for_u)
                    ((anon_union_8_10_166bea1d_for_u *)pMVar1->func_item)->func;
          if (item_01.func == (MIR_func_t)0x0) {
            pcVar13 = "";
            if (pMVar1->name != (char *)0x0) {
              pcVar13 = pMVar1->name;
            }
            pcVar14 = "A label not from any function in lref %s";
          }
          else {
            if (((MIR_label_t)pMVar1->original_vars_num == (MIR_label_t)0x0) ||
               ((MIR_func_t)((MIR_label_t)pMVar1->original_vars_num)->data == item_01.func)) {
              *(MIR_lref_data **)&pMVar1->nres = (item_01.func)->first_lref;
              (item_01.func)->first_lref = (MIR_lref_data *)pMVar1;
              goto LAB_001336e4;
            }
            pcVar13 = "";
            if (pMVar1->name != (char *)0x0) {
              pcVar13 = pMVar1->name;
            }
            pcVar14 = "Labels from different functions in lref %s";
          }
          MVar19 = MIR_wrong_lref_error;
LAB_001337eb:
          (*ctx->error_func)(MVar19,pcVar14,pcVar13);
          goto LAB_001337f0;
        }
LAB_001336e4:
        pMVar16 = (pMVar16->item_link).next;
      } while (pMVar16 != (MIR_item_t)0x0);
      do {
        if (pMVar9->item_type == MIR_func_item) {
          for (pMVar8 = (((pMVar9->u).func)->insns).head; pMVar8 != (MIR_insn_t_conflict)0x0;
              pMVar8 = (pMVar8->insn_link).next) {
            if (*(int *)&pMVar8->field_0x18 == 0xb4) {
              pMVar8->data = (void *)0x0;
            }
          }
        }
        pMVar9 = (pMVar9->item_link).next;
      } while (pMVar9 != (MIR_item_t)0x0);
    }
  }
  pVVar2 = ctx->modules_to_link;
  pMVar20 = (MIR_context_t)pVVar2->varr;
  if (pMVar20 != (MIR_context_t)0x0) {
    uVar10 = pVVar2->els_num + 1;
    if (pVVar2->size < uVar10) {
      sVar21 = (uVar10 >> 1) + uVar10;
      ppMVar11 = (MIR_module_t_conflict *)realloc(pMVar20,sVar21 * 8);
      pVVar2->varr = ppMVar11;
      pVVar2->size = sVar21;
    }
    sVar21 = pVVar2->els_num;
    pVVar2->els_num = sVar21 + 1;
    pVVar2->varr[sVar21] = m;
    return;
  }
  MIR_load_module_cold_1();
  pMVar23 = pMVar20;
  if (((item_01.func)->original_insns).tail == (MIR_insn_t_conflict)0x0) {
    if (item_01.func == (MIR_func_t)0x0) {
      pMVar23 = (MIR_context_t)0x0;
    }
    else {
      lVar22 = 0;
      aVar17 = item_01;
      do {
        if (((aVar17.func)->original_insns).tail != (MIR_insn_t_conflict)0x0) break;
        iVar6 = *(int *)&((aVar17.func)->insns).tail;
        switch(iVar6 + -5) {
        case 0:
switchD_0013386d_caseD_0:
          if ((aVar17.func == item_01.func) || (**(long **)&(aVar17.func)->last_temp_num == 0)) {
            lVar3 = *(long *)(*(long *)&(aVar17.func)->last_temp_num + 0x10);
            sVar21 = _MIR_type_size(pMVar23,*(MIR_type_t *)
                                             (*(long *)&(aVar17.func)->last_temp_num + 8));
            sVar21 = sVar21 * lVar3;
            goto LAB_00133975;
          }
          if (iVar6 != 8) {
            if (iVar6 == 7) goto switchD_0013386d_caseD_2;
            if (iVar6 == 6) goto switchD_0013386d_caseD_1;
            goto switchD_0013386d_default;
          }
          break;
        case 1:
switchD_0013386d_caseD_1:
          sVar21 = 8;
          if ((aVar17.func == item_01.func) || (**(long **)&(aVar17.func)->last_temp_num == 0))
          goto LAB_00133975;
          if (iVar6 != 8) {
            if (iVar6 == 7) goto switchD_0013386d_caseD_2;
            goto switchD_0013386d_default;
          }
          break;
        case 2:
switchD_0013386d_caseD_2:
          sVar21 = 8;
          if ((aVar17.func == item_01.func) || (**(long **)&(aVar17.func)->last_temp_num == 0))
          goto LAB_00133975;
          if (iVar6 == 8) break;
          goto switchD_0013386d_default;
        case 3:
          break;
        case 4:
          if ((aVar17.func == item_01.func) || (**(long **)&(aVar17.func)->last_temp_num == 0)) {
            sVar21 = *(size_t *)(*(long *)&(aVar17.func)->last_temp_num + 8);
            goto LAB_00133975;
          }
          switch(iVar6 + -5) {
          case 0:
            goto switchD_0013386d_caseD_0;
          case 1:
            goto switchD_0013386d_caseD_1;
          case 2:
            goto switchD_0013386d_caseD_2;
          case 3:
            break;
          default:
            goto switchD_0013386d_default;
          }
        default:
          goto switchD_0013386d_default;
        }
        if ((aVar17.func != item_01.func) && (**(long **)&(aVar17.func)->last_temp_num != 0)) break;
        item_00 = *(MIR_item_t_conflict *)(*(long *)&(aVar17.func)->last_temp_num + 8);
        if ((item_00->item_type != MIR_func_item) ||
           ((pMVar1 = (item_00->u).func, pMVar1->expr_p == '\0' || (pMVar1->nres != 1)))) {
          p_Var4 = pMVar20->error_func;
          pcVar13 = MIR_item_name(pMVar23,item_00);
          pMVar23 = (MIR_context_t)&DAT_00000002;
          (*p_Var4)(MIR_binary_io_error,
                    "%s can not be an expr which should be a func w/o calls and memory ops",pcVar13)
          ;
          goto LAB_00133b8c;
        }
        sVar21 = _MIR_type_size(pMVar23,*pMVar1->res_types);
LAB_00133975:
        if (extraout_EDX == 0) {
          aVar17 = (anon_union_8_10_166bea1d_for_u)((aVar17.func)->insns).head;
        }
        else {
          aVar17.func = (MIR_func_t)0x0;
        }
        lVar22 = sVar21 + lVar22;
      } while (aVar17.func != (MIR_func_t)0x0);
switchD_0013386d_default:
      pMVar23 = (MIR_context_t)(lVar22 + 7U & 0xfffffffffffffff8);
    }
    pvVar12 = malloc((size_t)pMVar23);
    (item_01.lref_data)->load_addr = pvVar12;
    if (pvVar12 == (void *)0x0) {
LAB_00133b8c:
      pcVar14 = MIR_item_name(pMVar23,(MIR_item_t_conflict)item_01.func);
      pcVar13 = "";
      if (pcVar14 != (char *)0x0) {
        pcVar13 = pcVar14;
      }
      pMVar23 = (MIR_context_t)0x3;
      (*pMVar20->error_func)(MIR_alloc_error,"Not enough memory to allocate data/bss %s",pcVar13);
      _MIR_publish_code(pMVar23,short_jmp_pattern,0xd);
      return;
    }
    *(undefined1 *)((long)&(item_01.func)->nres + 1) = 1;
  }
  if (item_01.func != (MIR_func_t)0x0) {
    pMVar20 = (MIR_context_t)(item_01.lref_data)->load_addr;
    aVar17 = item_01;
    do {
      if ((aVar17.func != item_01.func) &&
         (((aVar17.func)->original_insns).tail != (MIR_insn_t_conflict)0x0)) {
        return;
      }
      iVar6 = *(int *)&((aVar17.func)->insns).tail;
      switch(iVar6 + -5) {
      case 0:
switchD_001339fb_caseD_0:
        if ((aVar17.func != item_01.func) && (**(long **)&(aVar17.func)->last_temp_num != 0)) {
          if (iVar6 != 8) {
            if (iVar6 != 7) {
              if (iVar6 != 6) {
                return;
              }
              goto switchD_001339fb_caseD_1;
            }
            goto switchD_001339fb_caseD_2;
          }
          goto switchD_001339fb_caseD_3;
        }
        lVar22 = *(long *)(*(long *)&(aVar17.func)->last_temp_num + 0x10);
        sVar21 = _MIR_type_size(pMVar23,*(MIR_type_t *)(*(long *)&(aVar17.func)->last_temp_num + 8))
        ;
        sVar21 = sVar21 * lVar22;
        pMVar23 = pMVar20;
        memmove(pMVar20,(void *)(*(long *)&(aVar17.func)->last_temp_num + 0x20),sVar21);
        goto LAB_00133b19;
      case 1:
switchD_001339fb_caseD_1:
        if ((aVar17.func == item_01.func) || (**(long **)&(aVar17.func)->last_temp_num == 0)) {
          *(MIR_context_t *)(*(long *)&(aVar17.func)->last_temp_num + 0x18) = pMVar20;
          goto LAB_00133ad6;
        }
        if (iVar6 != 8) {
          if (iVar6 != 7) {
            return;
          }
          goto switchD_001339fb_caseD_2;
        }
switchD_001339fb_caseD_3:
        if ((aVar17.func != item_01.func) && (**(long **)&(aVar17.func)->last_temp_num != 0)) {
          return;
        }
        sVar21 = _MIR_type_size(pMVar23,**(MIR_type_t **)
                                          (*(long *)(*(long *)(*(long *)&(aVar17.func)->
                                                                         last_temp_num + 8) + 0x40)
                                          + 0x48));
        *(MIR_context_t *)(*(long *)&(aVar17.func)->last_temp_num + 0x10) = pMVar20;
LAB_00133b19:
        ((aVar17.func)->original_insns).tail = (MIR_insn_t_conflict)pMVar20;
LAB_00133b1d:
        if (extraout_EDX == 0) {
          aVar17 = (anon_union_8_10_166bea1d_for_u)((aVar17.func)->insns).head;
        }
        else {
          aVar17.func = (MIR_func_t)0x0;
        }
        pMVar20 = (MIR_context_t)(sVar21 + (long)&pMVar20->gen_ctx);
        if (aVar17.func == (MIR_func_t)0x0) {
          return;
        }
        break;
      case 2:
switchD_001339fb_caseD_2:
        if ((aVar17.func != item_01.func) && (**(long **)&(aVar17.func)->last_temp_num != 0)) {
          if (iVar6 != 8) {
            return;
          }
          goto switchD_001339fb_caseD_3;
        }
        *(MIR_context_t *)(*(long *)&(aVar17.func)->last_temp_num + 0x30) = pMVar20;
LAB_00133ad6:
        ((aVar17.func)->original_insns).tail = (MIR_insn_t_conflict)pMVar20;
        sVar21 = 8;
        goto LAB_00133b1d;
      case 3:
        goto switchD_001339fb_caseD_3;
      case 4:
        if ((aVar17.func == item_01.func) || (**(long **)&(aVar17.func)->last_temp_num == 0)) {
          pMVar23 = pMVar20;
          memset(pMVar20,0,*(size_t *)(*(long *)&(aVar17.func)->last_temp_num + 8));
          ((aVar17.func)->original_insns).tail = (MIR_insn_t_conflict)pMVar20;
          sVar21 = *(size_t *)(*(long *)&(aVar17.func)->last_temp_num + 8);
          goto LAB_00133b1d;
        }
        switch(iVar6 + -5) {
        case 0:
          goto switchD_001339fb_caseD_0;
        case 1:
          goto switchD_001339fb_caseD_1;
        case 2:
          goto switchD_001339fb_caseD_2;
        case 3:
          goto switchD_001339fb_caseD_3;
        default:
          goto switchD_001339fb_default;
        }
      default:
        goto switchD_001339fb_default;
      }
    } while( true );
  }
switchD_001339fb_default:
  return;
}

Assistant:

void MIR_load_module (MIR_context_t ctx, MIR_module_t m) {
  int lref_p = FALSE;
  mir_assert (m != NULL);
  for (MIR_item_t item = DLIST_HEAD (MIR_item_t, m->items); item != NULL;
       item = DLIST_NEXT (MIR_item_t, item)) {
    MIR_item_t first_item = item;

    if (item->item_type == MIR_bss_item || item->item_type == MIR_data_item
        || item->item_type == MIR_ref_data_item || item->item_type == MIR_lref_data_item
        || item->item_type == MIR_expr_data_item) {
      if (item->item_type == MIR_lref_data_item) lref_p = TRUE;
      item = load_bss_data_section (ctx, item, FALSE);
    } else if (item->item_type == MIR_func_item) {
      if (item->addr == NULL) {
        item->addr = _MIR_get_thunk (ctx);
#if defined(MIR_DEBUG)
        fprintf (stderr, "%016llx: %s\n", (unsigned long long) item->addr, item->u.func->name);
#endif
      }
      _MIR_redirect_thunk (ctx, item->addr, undefined_interface);
    }
    if (first_item->export_p) { /* update global item table */
      mir_assert (first_item->item_type != MIR_export_item
                  && first_item->item_type != MIR_import_item
                  && first_item->item_type != MIR_forward_item);
      if (setup_global (ctx, MIR_item_name (ctx, first_item), first_item->addr, first_item)
          && item->item_type == MIR_func_item
          && !func_redef_permission_p
#ifdef __APPLE__
          /* macosx can have multiple equal external inline definitions of the same function: */
          && strncmp (item->u.func->name, "__darwin", 8) != 0
#endif
      )
        MIR_get_error_func (ctx) (MIR_repeated_decl_error, "func %s is prohibited for redefinition",
                                  item->u.func->name);
    }
  }
  if (lref_p) link_module_lrefs (ctx, m);
  VARR_PUSH (MIR_module_t, modules_to_link, m);
}